

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::MockCodeGenerator::GetOutputFileContent_abi_cxx11_
          (string *__return_storage_ptr__,MockCodeGenerator *this,string_view generator_name,
          string_view parameter,FileDescriptor *file,GeneratorContext *context)

{
  char *pcVar1;
  size_t sVar2;
  ushort *puVar3;
  string_view file_00;
  string_view parsed_file_list;
  string_view first_message_name;
  Descriptor *pDVar4;
  size_t sVar5;
  char *pcVar6;
  FileDescriptor *this_00;
  FileDescriptor *pFVar7;
  size_t i;
  ulong uVar8;
  string_view parameter_00;
  string_view separator;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  all_files;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  names;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string local_50;
  
  this_00 = (FileDescriptor *)parameter._M_str;
  parameter_00._M_len = (char *)parameter._M_len;
  all_files.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_files.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_files.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar6 = parameter_00._M_len;
  pFVar7 = this_00;
  (**(code **)(*(long *)file + 0x30))();
  pcVar1 = (this_00->name_->_M_dataplus)._M_p;
  sVar2 = this_00->name_->_M_string_length;
  names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(&names,(long)all_files.
                         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)all_files.
                         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)all_files.
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)all_files.
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    local_60._M_str =
         (all_files.
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar8]->name_->_M_dataplus)._M_p;
    local_60._M_len =
         all_files.
         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar8]->name_->_M_string_length;
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&names,&local_60);
  }
  separator._M_str = pcVar6;
  separator._M_len = (size_t)",";
  absl::lts_20250127::strings_internal::
  JoinRange<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
            (&local_50,(strings_internal *)&names,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x1,separator);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&names.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  if (this_00->message_type_count_ < 1) {
    pcVar6 = "(none)";
    sVar5 = 6;
  }
  else {
    pDVar4 = FileDescriptor::message_type(this_00,0);
    puVar3 = (ushort *)(pDVar4->all_names_).payload_;
    sVar5 = (size_t)*puVar3;
    pcVar6 = (char *)((long)puVar3 + ~sVar5);
  }
  file_00._M_str = pcVar1;
  file_00._M_len = sVar2;
  parsed_file_list._M_str = local_50._M_dataplus._M_p;
  parsed_file_list._M_len = local_50._M_string_length;
  first_message_name._M_str = pcVar6;
  first_message_name._M_len = sVar5;
  parameter_00._M_str = (char *)pFVar7;
  GetOutputFileContent_abi_cxx11_
            (__return_storage_ptr__,this,generator_name,parameter_00,file_00,parsed_file_list,
             first_message_name);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Vector_base(&all_files.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::string MockCodeGenerator::GetOutputFileContent(
    absl::string_view generator_name, absl::string_view parameter,
    const FileDescriptor* file, GeneratorContext* context) {
  std::vector<const FileDescriptor*> all_files;
  context->ListParsedFiles(&all_files);
  return GetOutputFileContent(
      generator_name, parameter, file->name(), CommaSeparatedList(all_files),
      file->message_type_count() > 0 ? file->message_type(0)->name()
                                     : "(none)");
}